

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall
xmrig::ClientWriteBaton::ClientWriteBaton(ClientWriteBaton *this,string *header,string *body)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  
  (this->super_Baton<uv_write_s>).req.data = this;
  std::__cxx11::string::string((string *)&this->m_body,(string *)body);
  std::__cxx11::string::string((string *)&this->m_header,(string *)header);
  sVar2 = (this->m_header)._M_string_length;
  this->bufs[0].base = (this->m_header)._M_dataplus._M_p;
  this->bufs[0].len = sVar2;
  pcVar1 = (pointer)(this->m_body)._M_string_length;
  pcVar3 = pcVar1;
  if (pcVar1 != (pointer)0x0) {
    pcVar3 = (this->m_body)._M_dataplus._M_p;
  }
  this->bufs[1].base = pcVar3;
  this->bufs[1].len = (size_t)pcVar1;
  return;
}

Assistant:

inline ClientWriteBaton(const std::string &header, std::string &&body) :
        m_body(std::move(body)),
        m_header(header)
    {
        bufs[0].len  = m_header.size();
        bufs[0].base = const_cast<char *>(m_header.c_str());

        if (!m_body.empty()) {
            bufs[1].len  = m_body.size();
            bufs[1].base = const_cast<char *>(m_body.c_str());
        }
        else {
            bufs[1].base = nullptr;
            bufs[1].len  = 0;
        }
    }